

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O2

void __thiscall Memory::HeapAllocator::~HeapAllocator(HeapAllocator *this)

{
  bool bVar1;
  char16 *pcVar2;
  anon_class_8_1_ca93d37e local_30;
  anon_class_8_1_ca93d37e fakeHeapLeak;
  bool hasFakeHeapLeak;
  
  local_30.hasFakeHeapLeak = (bool *)((long)&fakeHeapLeak.hasFakeHeapLeak + 7);
  fakeHeapLeak.hasFakeHeapLeak._7_1_ = 0;
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,LeakReportFlag);
  if (bVar1) {
    ~HeapAllocator::anon_class_8_1_ca93d37e::operator()(&local_30);
    LeakReport::StartSection(L"Heap Leaks");
    LeakReport::StartRedirectOutput();
    bVar1 = CheckLeaks();
    LeakReport::EndRedirectOutput();
    LeakReport::EndSection();
    LeakReport::Print(
                     L"--------------------------------------------------------------------------------\n"
                     );
    if (!bVar1) {
      LeakReport::Print(L"Heap Leaked Object: %d bytes (%d objects)\n",(this->data).outstandingBytes
                        ,(this->data).allocCount - (this->data).deleteCount);
    }
  }
  if (DAT_014303cd == '\x01') {
    ~HeapAllocator::anon_class_8_1_ca93d37e::operator()(&local_30);
    Output::CaptureStart();
    Output::Print(
                 L"-------------------------------------------------------------------------------------\n"
                 );
    Output::Print(L"Heap Leaks\n");
    Output::Print(
                 L"-------------------------------------------------------------------------------------\n"
                 );
    bVar1 = CheckLeaks();
    if (bVar1) {
      pcVar2 = Output::CaptureEnd();
      free(pcVar2);
    }
    else {
      Output::Print(
                   L"-------------------------------------------------------------------------------------\n"
                   );
      Output::Print(L"Heap Leaked Object: %d bytes (%d objects)\n",(this->data).outstandingBytes,
                    (this->data).allocCount - (this->data).deleteCount);
      pcVar2 = Output::CaptureEnd();
      MemoryLeakCheck::AddLeakDump
                (pcVar2,(this->data).outstandingBytes,
                 (this->data).allocCount - (this->data).deleteCount);
    }
  }
  if ((DAT_01441dc5 == '\x01') && (this->m_privateHeap != (HANDLE)0x0)) {
    this->m_privateHeap = (HANDLE)0x0;
  }
  return;
}

Assistant:

HeapAllocator::~HeapAllocator()
{
#ifdef HEAP_TRACK_ALLOC
    bool hasFakeHeapLeak = false;
    auto fakeHeapLeak = [&]()
    {
        // REVIEW: Okay to use global flags?
        if (Js::Configuration::Global.flags.ForceMemoryLeak && !hasFakeHeapLeak)
        {
            AUTO_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
            struct FakeMemory { int f; };
            HeapNewStruct(FakeMemory);
            hasFakeHeapLeak = true;
        }
    };

#ifdef LEAK_REPORT
    // REVIEW: Okay to use global flags?
    if (Js::Configuration::Global.flags.IsEnabled(Js::LeakReportFlag))
    {
        fakeHeapLeak();
        LeakReport::StartSection(_u("Heap Leaks"));
        LeakReport::StartRedirectOutput();
        bool leaked = !HeapAllocator::CheckLeaks();
        LeakReport::EndRedirectOutput();
        LeakReport::EndSection();

        LeakReport::Print(_u("--------------------------------------------------------------------------------\n"));
        if (leaked)
        {
            LeakReport::Print(_u("Heap Leaked Object: %d bytes (%d objects)\n"),
                data.outstandingBytes, data.allocCount - data.deleteCount);
        }
    }
#endif // LEAK_REPORT

#ifdef CHECK_MEMORY_LEAK
    // REVIEW: Okay to use global flags?
    if (Js::Configuration::Global.flags.CheckMemoryLeak)
    {
        fakeHeapLeak();
        Output::CaptureStart();
        Output::Print(_u("-------------------------------------------------------------------------------------\n"));
        Output::Print(_u("Heap Leaks\n"));
        Output::Print(_u("-------------------------------------------------------------------------------------\n"));
        if (!HeapAllocator::CheckLeaks())
        {
            Output::Print(_u("-------------------------------------------------------------------------------------\n"));
            Output::Print(_u("Heap Leaked Object: %d bytes (%d objects)\n"),
                data.outstandingBytes, data.allocCount - data.deleteCount);
            char16 * buffer = Output::CaptureEnd();
            MemoryLeakCheck::AddLeakDump(buffer, data.outstandingBytes, data.allocCount - data.deleteCount);
        }
        else
        {
            free(Output::CaptureEnd());
        }
    }
#endif // CHECK_MEMORY_LEAK
#endif // HEAP_TRACK_ALLOC

    // destroy private heap after leak check
    if (CONFIG_FLAG(PrivateHeap))
    {
        this->DestroyPrivateHeap();
    }

#ifdef INTERNAL_MEM_PROTECT_HEAP_ALLOC
    if (memProtectHeapHandle != nullptr)
    {
        MemProtectHeapDestroy(memProtectHeapHandle);
    }
#endif // INTERNAL_MEM_PROTECT_HEAP_ALLOC
}